

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O1

QPlatformTheme * __thiscall
QOffscreenIntegration::createPlatformTheme(QOffscreenIntegration *this,QString *name)

{
  char cVar1;
  QPlatformTheme *this_00;
  QStringView QVar2;
  QStringView QVar3;
  
  if (((name->d).size == 9) &&
     (QVar2.m_data = (name->d).ptr, QVar2.m_size = 9, QVar3.m_data = L"offscreen", QVar3.m_size = 9,
     cVar1 = QtPrivate::equalStrings(QVar2,QVar3), cVar1 != '\0')) {
    this_00 = (QPlatformTheme *)operator_new(0x10);
    QPlatformTheme::QPlatformTheme(this_00);
    *(undefined ***)this_00 = &PTR__QPlatformTheme_0011c0e8;
    return this_00;
  }
  return (QPlatformTheme *)0x0;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }